

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

void print_object(Object *object,char *new_line,_Bool print_quotation)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  uint *puVar4;
  CrispyValue value;
  int local_50;
  int i;
  _Bool first;
  ObjList *list;
  ObjNativeFunc *n_fn;
  ObjLambda *lambda;
  ObjString *string;
  char *quotation;
  _Bool print_quotation_local;
  char *new_line_local;
  Object *object_local;
  
  switch(object->type) {
  case OBJ_STRING:
    pcVar3 = "";
    if (print_quotation) {
      pcVar3 = "\"";
    }
    uVar1._0_1_ = object[1].marked;
    uVar1._1_3_ = *(undefined3 *)&object[1].field_0x1;
    uVar1._4_4_ = object[1].type;
    printf("%s%.*s%s%s",pcVar3,uVar1 & 0xffffffff,object[1].next,pcVar3,new_line);
    break;
  case OBJ_LAMBDA:
    printf("<function of arity %d>%s",(ulong)object[1].marked,new_line);
    break;
  case OBJ_NATIVE_FUNC:
    printf("<native function of arity %d>%s",(ulong)(byte)object[1].field_0x1,new_line);
    break;
  case OBJ_DICT:
    print_dict((ObjDict *)object,false);
    printf("%s",new_line);
    break;
  case OBJ_LIST:
    bVar2 = true;
    printf("[");
    for (local_50 = 0; (object_t *)(long)local_50 < object[1].next; local_50 = local_50 + 1) {
      if (bVar2) {
        bVar2 = false;
      }
      else {
        printf(", ");
      }
      puVar4 = (uint *)(*(long *)(object + 2) + (long)local_50 * 0x10);
      value._4_4_ = 0;
      value.type = *puVar4;
      value.field_1.p_value = ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(puVar4 + 2))->p_value;
      print_value(value,false,true);
    }
    printf("]%s",new_line);
    break;
  default:
    printf("Invalid object%s",new_line);
  }
  return;
}

Assistant:

static void print_object(Object *object, const char *new_line, bool print_quotation) {
    switch (object->type) {
        case OBJ_STRING: {
            const char *quotation = print_quotation ? "\"" : "";
            ObjString *string = (ObjString *) object;
            printf("%s%.*s%s%s", quotation, (int) string->length, string->start, quotation, new_line);
            break;
        }
        case OBJ_LAMBDA: {
            ObjLambda *lambda = (ObjLambda *) object;
            printf("<function of arity %d>%s", lambda->num_params, new_line);
            break;
        }
        case OBJ_NATIVE_FUNC: {
            ObjNativeFunc *n_fn = (ObjNativeFunc *) object;
            printf("<native function of arity %d>%s", n_fn->num_params, new_line);
            break;
        }
        case OBJ_DICT: {
            print_dict((ObjDict *) object, false);
            printf("%s", new_line);
            break;
        }
        case OBJ_LIST: {
            ObjList *list = (ObjList *) object;
            bool first = true;

            // TODO Fix print quotation

            printf("[");
            for (int i = 0; i < list->content.count; ++i) {
                if (first) {
                    first = false;
                } else {
                    printf(", ");
                }
                print_value(list->content.values[i], false, true);
            }
            printf("]%s", new_line);

            break;
        }
        default:
            printf("Invalid object%s", new_line);
    }
}